

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O2

void __thiscall cmInstallFilesCommand::FinalPass(cmInstallFilesCommand *this)

{
  size_type sVar1;
  pointer pbVar2;
  char *pcVar3;
  pointer pbVar4;
  string *this_00;
  _Alloc_hider _Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string temps;
  string testf;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_120;
  string local_100;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_e0;
  pointer local_d8;
  char *local_d0;
  undefined8 local_c8;
  char local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (this->IsFilesForm == false) {
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = '\0';
    std::__cxx11::string::string
              ((string *)&local_90,
               (string *)
               (this->FinalArgs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    pbVar4 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar2 - (long)pbVar4) < 0x21) {
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&local_100,(string *)pbVar4);
      pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&local_120,pcVar3,(allocator *)&local_b0);
      cmSystemTools::Glob(&local_120,&local_100,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_148);
      std::__cxx11::string::~string((string *)&local_120);
      for (_Var5._M_p = local_148._M_dataplus._M_p;
          _Var5._M_p != (pointer)local_148._M_string_length; _Var5._M_p = _Var5._M_p + 0x20) {
        FindInstallSource_abi_cxx11_(&local_120,this,*(char **)_Var5._M_p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
                   ,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
      }
      std::__cxx11::string::~string((string *)&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_148);
    }
    else {
      local_e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files;
      while (pbVar4 = pbVar4 + 1, pbVar4 != pbVar2) {
        local_d8 = pbVar4;
        std::__cxx11::string::string((string *)&local_100,(string *)pbVar4);
        cmsys::SystemTools::GetFilenamePath(&local_120,&local_100);
        sVar1 = local_120._M_string_length;
        std::__cxx11::string::~string((string *)&local_120);
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_148,&local_100);
          std::operator+(&local_120,&local_148,&local_90);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          this_00 = &local_148;
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_50,&local_100);
          std::operator+(&local_b0,&local_50,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_70,&local_100);
          std::operator+(&local_148,&local_b0,&local_70);
          std::operator+(&local_120,&local_148,&local_90);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_b0);
          this_00 = &local_50;
        }
        std::__cxx11::string::~string((string *)this_00);
        FindInstallSource_abi_cxx11_(&local_120,this,local_d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_e0,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
        pbVar4 = local_d8;
        pbVar2 = (this->FinalArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    CreateInstallGenerator(this);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void cmInstallFilesCommand::FinalPass()
{
  // No final pass for "FILES" form of arguments.
  if(this->IsFilesForm)
    {
    return;
    }

  std::string testf;
  std::string ext = this->FinalArgs[0];

  // two different options
  if (this->FinalArgs.size() > 1)
    {
    // now put the files into the list
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    ++s;
    // for each argument, get the files
    for (;s != this->FinalArgs.end(); ++s)
      {
      // replace any variables
      std::string temps = *s;
      if (!cmSystemTools::GetFilenamePath(temps).empty())
        {
          testf = cmSystemTools::GetFilenamePath(temps) + "/" +
            cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
        }
      else
        {
          testf = cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
        }

      // add to the result
      this->Files.push_back(this->FindInstallSource(testf.c_str()));
      }
    }
  else     // reg exp list
    {
    std::vector<std::string> files;
    std::string regex = this->FinalArgs[0];
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(),
                        regex, files);

    std::vector<std::string>::iterator s = files.begin();
    // for each argument, get the files
    for (;s != files.end(); ++s)
      {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
      }
    }

  this->CreateInstallGenerator();
}